

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O1

uint32_t __thiscall Cache::log2i(Cache *this,uint32_t val)

{
  bool bVar1;
  uint32_t uVar2;
  
  if (val != 0) {
    uVar2 = 0;
    if ((val != 1) && (uVar2 = 0, 1 < val)) {
      uVar2 = 0;
      do {
        uVar2 = uVar2 + 1;
        bVar1 = 3 < val;
        val = val >> 1;
      } while (bVar1);
    }
    return uVar2;
  }
  return 0xffffffff;
}

Assistant:

uint32_t Cache::log2i(uint32_t val) {
  if (val == 0)
    return uint32_t(-1);
  if (val == 1)
    return 0;
  uint32_t ret = 0;
  while (val > 1) {
    val >>= 1;
    ret++;
  }
  return ret;
}